

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,H42 *hasher,int *dist_cache,size_t *last_insert_len,
               Command *commands,size_t *num_commands,size_t *num_literals)

{
  size_t *psVar1;
  long lVar2;
  ushort uVar3;
  size_t sVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  size_t sVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  int *piVar23;
  ulong uVar24;
  ulong uVar25;
  ushort uVar26;
  ulong uVar27;
  byte bVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  char *pcVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  Command *pCVar40;
  bool bVar41;
  bool bVar42;
  ulong local_150;
  ulong local_140;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_108;
  ulong local_100;
  ulong local_f0;
  ulong local_e0;
  size_t local_c8;
  
  local_c8 = *last_insert_len;
  uVar27 = position + num_bytes;
  uVar8 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar8 = position;
  }
  lVar17 = 0x200;
  if (params->quality < 9) {
    lVar17 = 0x40;
  }
  pCVar40 = commands;
  if (uVar27 <= position + 4) {
LAB_0010cac1:
    *last_insert_len = (local_c8 + uVar27) - position;
    *num_commands = *num_commands + ((long)pCVar40 - (long)commands >> 4);
    return;
  }
  uVar35 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  local_e0 = lVar17 + position;
  lVar2 = position - 1;
  uVar33 = position;
LAB_0010b7db:
  local_128 = uVar27 - uVar33;
  uVar14 = uVar35;
  if (uVar33 < uVar35) {
    uVar14 = uVar33;
  }
  uVar9 = uVar33 & ringbuffer_mask;
  piVar10 = (int *)(ringbuffer + uVar9);
  uVar32 = (uint)(*(int *)(ringbuffer + uVar9) * 0x1e35a7bd) >> 0x11;
  uVar13 = (ulong)((uint)local_128 & 7);
  local_108 = 0x1f90;
  bVar42 = false;
  local_150 = 0;
  lVar29 = 0;
  local_f0 = 0;
  local_120 = 0;
  local_100 = 0x1f90;
  do {
    uVar39 = (long)kDistanceCacheOffset[lVar29] + (long)dist_cache[kDistanceCacheIndex[lVar29]];
    uVar38 = uVar33 - uVar39;
    if ((((lVar29 == 0) || (hasher->tiny_hash[uVar38 & 0xffff] == (uint8_t)uVar32)) &&
        (uVar39 <= uVar14)) && (uVar38 < uVar33)) {
      if (7 < local_128) {
        lVar22 = 0;
        uVar11 = 0;
LAB_0010b8d6:
        if (*(ulong *)(piVar10 + uVar11 * 2) ==
            *(ulong *)(ringbuffer + uVar11 * 8 + (uVar38 & ringbuffer_mask))) goto code_r0x0010b8e8;
        uVar11 = *(ulong *)(ringbuffer + uVar11 * 8 + (uVar38 & ringbuffer_mask)) ^
                 *(ulong *)(piVar10 + uVar11 * 2);
        uVar38 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
          }
        }
        uVar11 = (uVar38 >> 3 & 0x1fffffff) - lVar22;
        goto LAB_0010b915;
      }
      uVar20 = 0;
      piVar23 = piVar10;
LAB_0010b971:
      uVar11 = uVar20;
      if (uVar13 != 0) {
        uVar34 = uVar13 | uVar20;
        uVar12 = uVar13;
        do {
          uVar11 = uVar20;
          if (ringbuffer[uVar20 + (uVar38 & ringbuffer_mask)] != (uint8_t)*piVar23) break;
          piVar23 = (int *)((long)piVar23 + 1);
          uVar20 = uVar20 + 1;
          uVar12 = uVar12 - 1;
          uVar11 = uVar34;
        } while (uVar12 != 0);
      }
LAB_0010b915:
      if ((1 < uVar11) &&
         (uVar38 = uVar11 * 0x21c + kDistanceShortCodeCost[lVar29], local_108 < uVar38)) {
        bVar42 = true;
        local_f0 = uVar11;
        local_100 = uVar38;
        local_150 = uVar11;
        local_120 = uVar39;
        local_108 = uVar38;
      }
    }
    lVar29 = lVar29 + 1;
  } while (lVar29 != 0x10);
  uVar21 = uVar32 & 0x1ff;
  sVar4 = hasher->max_hops;
  uVar39 = uVar33 - hasher->addr[uVar32];
  uVar3 = hasher->head[uVar32];
  uVar38 = (ulong)uVar3;
  uVar11 = (ulong)((uint)local_128 & 7);
  uVar20 = 0;
  uVar13 = uVar39;
  sVar18 = sVar4;
  do {
    bVar41 = sVar18 == 0;
    sVar18 = sVar18 - 1;
    if (bVar41) break;
    uVar20 = uVar20 + uVar13;
    if (uVar20 <= uVar14) {
      uVar12 = (ulong)*(ushort *)
                       ((long)&hasher->banks[0].slots[uVar38].next + (ulong)(uVar21 << 0xb));
      uVar13 = (ulong)*(ushort *)
                       ((long)&hasher->banks[0].slots[uVar38].delta + (ulong)(uVar21 << 0xb));
      uVar38 = uVar12;
      if (uVar9 + local_150 <= ringbuffer_mask) {
        uVar12 = uVar33 - uVar20 & ringbuffer_mask;
        if ((uVar12 + local_150 <= ringbuffer_mask) &&
           (ringbuffer[uVar9 + local_150] == ringbuffer[uVar12 + local_150])) {
          if (7 < local_128) {
            lVar29 = 0;
            uVar34 = 0;
LAB_0010baa1:
            if (*(ulong *)(piVar10 + uVar34 * 2) == *(ulong *)(ringbuffer + uVar34 * 8 + uVar12))
            goto code_r0x0010bab3;
            uVar34 = *(ulong *)(ringbuffer + uVar34 * 8 + uVar12) ^ *(ulong *)(piVar10 + uVar34 * 2)
            ;
            uVar12 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar34 = (uVar12 >> 3 & 0x1fffffff) - lVar29;
            goto LAB_0010badb;
          }
          uVar30 = 0;
          piVar23 = piVar10;
LAB_0010bb46:
          uVar34 = uVar30;
          if (uVar11 != 0) {
            uVar24 = uVar11 | uVar30;
            uVar31 = uVar11;
            do {
              uVar34 = uVar30;
              if (ringbuffer[uVar30 + uVar12] != (uint8_t)*piVar23) break;
              piVar23 = (int *)((long)piVar23 + 1);
              uVar30 = uVar30 + 1;
              uVar31 = uVar31 - 1;
              uVar34 = uVar24;
            } while (uVar31 != 0);
          }
LAB_0010badb:
          if (3 < uVar34) {
            iVar19 = 0x1f;
            if ((uint)uVar20 != 0) {
              for (; (uint)uVar20 >> iVar19 == 0; iVar19 = iVar19 + -1) {
              }
            }
            uVar12 = (ulong)(iVar19 * -0x78 + 0x1e00) + uVar34 * 0x21c;
            if (local_108 < uVar12) {
              bVar42 = true;
              local_f0 = uVar34;
              local_100 = uVar12;
              local_150 = uVar34;
              local_120 = uVar20;
              local_108 = uVar12;
            }
          }
        }
      }
    }
  } while (uVar20 <= uVar14);
  uVar26 = hasher->free_slot_idx[uVar21];
  hasher->free_slot_idx[uVar21] = uVar26 + 1;
  uVar7 = uVar26 & 0x1ff;
  hasher->tiny_hash[uVar33 & 0xffff] = (uint8_t)uVar32;
  if (0xfffe < uVar39) {
    uVar39 = 0xffff;
  }
  *(short *)((long)&hasher->banks[0].slots[uVar7].delta + (ulong)(uVar21 << 0xb)) = (short)uVar39;
  *(ushort *)((long)&hasher->banks[0].slots[uVar7].next + (ulong)(uVar21 << 0xb)) = uVar3;
  hasher->addr[uVar32] = (uint32_t)uVar33;
  hasher->head[uVar32] = (uint16_t)uVar7;
  if (bVar42) {
    local_140 = 0;
    bVar42 = false;
  }
  else {
    if ((hasher->dict_search_stats_).num_lookups >> 7 <= (hasher->dict_search_stats_).num_matches) {
      uVar9 = (ulong)((uint)(*piVar10 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      sVar18 = (hasher->dict_search_stats_).num_lookups;
      bVar42 = false;
      local_140 = 0;
      lVar29 = 0;
LAB_0010bc7e:
      uVar3 = kStaticDictionaryHash[uVar9];
      sVar18 = sVar18 + 1;
      (hasher->dict_search_stats_).num_lookups = sVar18;
      if ((ulong)uVar3 != 0) {
        uVar13 = (ulong)(uVar3 & 0x1f);
        bVar41 = true;
        if (uVar13 <= local_128) {
          pcVar36 = &kBrotliDictionary +
                    uVar13 * (uVar3 >> 5) +
                    (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar13 * 4);
          if (7 < uVar13) {
            uVar39 = (ulong)(uVar3 & 0x18);
            lVar22 = 0;
            uVar38 = 0;
LAB_0010bd11:
            if (*(ulong *)(pcVar36 + uVar38 * 8) == *(ulong *)(piVar10 + uVar38 * 2))
            goto code_r0x0010bd23;
            uVar39 = *(ulong *)(piVar10 + uVar38 * 2) ^ *(ulong *)(pcVar36 + uVar38 * 8);
            uVar38 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
              }
            }
            uVar38 = (uVar38 >> 3 & 0x1fffffff) - lVar22;
            goto LAB_0010bd6f;
          }
          uVar39 = 0;
          goto LAB_0010bdfd;
        }
        goto LAB_0010bca2;
      }
      goto LAB_0010bcbd;
    }
    bVar42 = true;
    local_140 = 0;
  }
  goto LAB_0010be44;
code_r0x0010b8e8:
  uVar11 = uVar11 + 1;
  lVar22 = lVar22 + -8;
  uVar20 = local_128 & 0xfffffffffffffff8;
  piVar23 = (int *)((long)piVar10 + (local_128 & 0xfffffffffffffff8));
  if (local_128 >> 3 == uVar11) goto LAB_0010b971;
  goto LAB_0010b8d6;
code_r0x0010bab3:
  uVar34 = uVar34 + 1;
  lVar29 = lVar29 + -8;
  uVar30 = local_128 & 0xfffffffffffffff8;
  piVar23 = (int *)(ringbuffer + (local_128 & 0xfffffffffffffff8) + uVar9);
  if (local_128 >> 3 == uVar34) goto LAB_0010bb46;
  goto LAB_0010baa1;
code_r0x0010bd23:
  uVar38 = uVar38 + 1;
  lVar22 = lVar22 + -8;
  if ((uVar3 & 0x1f) >> 3 == uVar38) goto code_r0x0010bd2f;
  goto LAB_0010bd11;
code_r0x0010bd2f:
  pcVar36 = pcVar36 + -lVar22;
LAB_0010bdfd:
  uVar11 = (ulong)uVar3 & 7;
  uVar38 = uVar39;
  if ((uVar3 & 7) != 0) {
    uVar20 = uVar39 | uVar11;
    do {
      uVar38 = uVar39;
      if (*(char *)((long)piVar10 + uVar39) != *pcVar36) break;
      pcVar36 = pcVar36 + 1;
      uVar39 = uVar39 + 1;
      uVar11 = uVar11 - 1;
      uVar38 = uVar20;
    } while (uVar11 != 0);
  }
LAB_0010bd6f:
  bVar41 = true;
  if ((uVar38 != 0) && (uVar13 < uVar38 + 10)) {
    uVar39 = (ulong)(uVar3 >> 5) + uVar14 + 1 +
             ((ulong)""[uVar13 - uVar38] << ((&kBrotliDictionarySizeBitsByLength)[uVar13] & 0x3f));
    iVar19 = 0x1f;
    uVar32 = (uint)uVar39;
    if (uVar32 != 0) {
      for (; uVar32 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    uVar11 = (uVar38 * 0x21c - (ulong)(uint)(iVar19 * 0x78)) + 0x1e00;
    if (local_100 <= uVar11) {
      local_140 = uVar13 ^ uVar38;
      bVar41 = false;
      local_120 = uVar39;
      local_100 = uVar11;
      local_f0 = uVar38;
    }
  }
LAB_0010bca2:
  if (!bVar41) {
    psVar1 = &(hasher->dict_search_stats_).num_matches;
    *psVar1 = *psVar1 + 1;
    bVar42 = true;
  }
LAB_0010bcbd:
  uVar9 = uVar9 + 1;
  bVar41 = lVar29 != 0;
  lVar29 = lVar29 + 1;
  if (bVar41) goto LAB_0010be32;
  goto LAB_0010bc7e;
LAB_0010be32:
  bVar42 = !bVar42;
LAB_0010be44:
  if (!bVar42) {
    uVar14 = (lVar2 + num_bytes) - uVar33;
    iVar19 = 0;
LAB_0010bf51:
    local_128 = local_128 - 1;
    uVar9 = local_f0 - 1;
    if (local_128 <= local_f0 - 1) {
      uVar9 = local_128;
    }
    if (4 < params->quality) {
      uVar9 = 0;
    }
    uVar13 = uVar33 + 1;
    uVar38 = uVar35;
    if (uVar13 < uVar35) {
      uVar38 = uVar13;
    }
    uVar12 = uVar13 & ringbuffer_mask;
    piVar10 = (int *)(ringbuffer + uVar12);
    uVar32 = (uint)(*(int *)(ringbuffer + uVar12) * 0x1e35a7bd) >> 0x11;
    uVar20 = (ulong)((uint)local_128 & 7);
    local_150 = 0x1f90;
    bVar42 = false;
    lVar29 = 0;
    uVar39 = 0;
    local_118 = 0;
    uVar11 = 0x1f90;
LAB_0010bff3:
    uVar34 = (long)kDistanceCacheOffset[lVar29] + (long)dist_cache[kDistanceCacheIndex[lVar29]];
    uVar30 = uVar13 - uVar34;
    if ((((lVar29 == 0) || (hasher->tiny_hash[uVar30 & 0xffff] == (uint8_t)uVar32)) &&
        (uVar34 <= uVar38)) && (uVar30 < uVar13)) {
      uVar31 = uVar20;
      if (7 < local_128) {
        lVar22 = 0;
        uVar24 = 0;
LAB_0010c057:
        if (*(ulong *)(piVar10 + uVar24 * 2) ==
            *(ulong *)(ringbuffer + uVar24 * 8 + (uVar30 & ringbuffer_mask))) goto code_r0x0010c069;
        uVar31 = *(ulong *)(ringbuffer + uVar24 * 8 + (uVar30 & ringbuffer_mask)) ^
                 *(ulong *)(piVar10 + uVar24 * 2);
        uVar30 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
        uVar24 = (uVar30 >> 3 & 0x1fffffff) - lVar22;
        goto LAB_0010c095;
      }
      uVar24 = 0;
      piVar23 = piVar10;
      goto joined_r0x0010c105;
    }
    goto LAB_0010c0eb;
  }
  local_c8 = local_c8 + 1;
  position = uVar33 + 1;
  if (local_e0 < position) {
    if ((uint)((int)lVar17 * 4) + local_e0 < position) {
      uVar14 = uVar33 + 0x11;
      if (uVar27 - 4 <= uVar33 + 0x11) {
        uVar14 = uVar27 - 4;
      }
      for (; position < uVar14; position = position + 4) {
        uVar32 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar7 = uVar32 & 0x1ff;
        uVar3 = hasher->free_slot_idx[uVar7];
        hasher->free_slot_idx[uVar7] = uVar3 + 1;
        uVar21 = uVar3 & 0x1ff;
        uVar33 = position - hasher->addr[uVar32];
        if (0xfffe < uVar33) {
          uVar33 = 0xffff;
        }
        hasher->tiny_hash[position & 0xffff] = (uint8_t)uVar32;
        *(short *)((long)&hasher->banks[0].slots[uVar21].delta + (ulong)(uVar7 << 0xb)) =
             (short)uVar33;
        *(uint16_t *)((long)&hasher->banks[0].slots[uVar21].next + (ulong)(uVar7 << 0xb)) =
             hasher->head[uVar32];
        hasher->addr[uVar32] = (uint32_t)position;
        hasher->head[uVar32] = (uint16_t)uVar21;
        local_c8 = local_c8 + 4;
      }
    }
    else {
      uVar14 = uVar33 + 9;
      if (uVar27 - 3 <= uVar33 + 9) {
        uVar14 = uVar27 - 3;
      }
      for (; position < uVar14; position = position + 2) {
        uVar32 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar7 = uVar32 & 0x1ff;
        uVar3 = hasher->free_slot_idx[uVar7];
        hasher->free_slot_idx[uVar7] = uVar3 + 1;
        uVar21 = uVar3 & 0x1ff;
        uVar33 = position - hasher->addr[uVar32];
        if (0xfffe < uVar33) {
          uVar33 = 0xffff;
        }
        hasher->tiny_hash[position & 0xffff] = (uint8_t)uVar32;
        *(short *)((long)&hasher->banks[0].slots[uVar21].delta + (ulong)(uVar7 << 0xb)) =
             (short)uVar33;
        *(uint16_t *)((long)&hasher->banks[0].slots[uVar21].next + (ulong)(uVar7 << 0xb)) =
             hasher->head[uVar32];
        hasher->addr[uVar32] = (uint32_t)position;
        hasher->head[uVar32] = (uint16_t)uVar21;
        local_c8 = local_c8 + 2;
      }
    }
  }
  goto LAB_0010ca55;
code_r0x0010c069:
  uVar24 = uVar24 + 1;
  lVar22 = lVar22 + -8;
  if (uVar14 >> 3 == uVar24) goto code_r0x0010c077;
  goto LAB_0010c057;
code_r0x0010c077:
  uVar24 = -lVar22;
  piVar23 = (int *)((long)piVar10 - lVar22);
joined_r0x0010c105:
  for (; (uVar31 != 0 && (ringbuffer[uVar24 + (uVar30 & ringbuffer_mask)] == (uint8_t)*piVar23));
      uVar24 = uVar24 + 1) {
    uVar31 = uVar31 - 1;
    piVar23 = (int *)((long)piVar23 + 1);
  }
LAB_0010c095:
  if ((1 < uVar24) && (uVar30 = uVar24 * 0x21c + kDistanceShortCodeCost[lVar29], local_150 < uVar30)
     ) {
    bVar42 = true;
    uVar39 = uVar24;
    uVar11 = uVar30;
    uVar9 = uVar24;
    local_150 = uVar30;
    local_118 = uVar34;
  }
LAB_0010c0eb:
  lVar29 = lVar29 + 1;
  if (lVar29 == 0x10) goto LAB_0010c132;
  goto LAB_0010bff3;
LAB_0010c132:
  uVar21 = uVar32 & 0x1ff;
  uVar31 = uVar13 - hasher->addr[uVar32];
  uVar3 = hasher->head[uVar32];
  uVar34 = (ulong)uVar3;
  uVar30 = (ulong)((uint)local_128 & 7);
  uVar24 = 0;
  uVar20 = uVar31;
  sVar18 = sVar4;
LAB_0010c18e:
  bVar41 = sVar18 != 0;
  sVar18 = sVar18 - 1;
  if (bVar41) {
    uVar24 = uVar24 + uVar20;
    if (uVar24 <= uVar38) {
      uVar37 = (ulong)*(ushort *)
                       ((long)&hasher->banks[0].slots[uVar34].next + (ulong)(uVar21 << 0xb));
      uVar20 = (ulong)*(ushort *)
                       ((long)&hasher->banks[0].slots[uVar34].delta + (ulong)(uVar21 << 0xb));
      uVar34 = uVar37;
      if (ringbuffer_mask < uVar12 + uVar9) goto LAB_0010c2a5;
      uVar37 = uVar13 - uVar24 & ringbuffer_mask;
      if ((ringbuffer_mask < uVar9 + uVar37) ||
         (ringbuffer[uVar12 + uVar9] != ringbuffer[uVar9 + uVar37])) goto LAB_0010c2a5;
      uVar15 = uVar30;
      if (7 < local_128) {
        lVar29 = 0;
        uVar25 = 0;
LAB_0010c215:
        if (*(ulong *)(piVar10 + uVar25 * 2) == *(ulong *)(ringbuffer + uVar25 * 8 + uVar37))
        goto code_r0x0010c228;
        uVar15 = *(ulong *)(ringbuffer + uVar25 * 8 + uVar37) ^ *(ulong *)(piVar10 + uVar25 * 2);
        uVar37 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
          }
        }
        uVar25 = (uVar37 >> 3 & 0x1fffffff) - lVar29;
        goto LAB_0010c25d;
      }
      uVar25 = 0;
      piVar23 = piVar10;
      goto joined_r0x0010c2cb;
    }
    goto LAB_0010c2a5;
  }
  goto LAB_0010c30f;
code_r0x0010c228:
  uVar25 = uVar25 + 1;
  lVar29 = lVar29 + -8;
  if (uVar14 >> 3 == uVar25) goto code_r0x0010c236;
  goto LAB_0010c215;
code_r0x0010c236:
  uVar25 = -lVar29;
  piVar23 = (int *)((long)piVar10 - lVar29);
joined_r0x0010c2cb:
  for (; (uVar15 != 0 && (ringbuffer[uVar25 + uVar37] == (uint8_t)*piVar23)); uVar25 = uVar25 + 1) {
    uVar15 = uVar15 - 1;
    piVar23 = (int *)((long)piVar23 + 1);
  }
LAB_0010c25d:
  if (3 < uVar25) {
    iVar5 = 0x1f;
    if ((uint)uVar24 != 0) {
      for (; (uint)uVar24 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    uVar37 = (ulong)(iVar5 * -0x78 + 0x1e00) + uVar25 * 0x21c;
    if (local_150 < uVar37) {
      bVar42 = true;
      uVar39 = uVar25;
      uVar11 = uVar37;
      uVar9 = uVar25;
      local_150 = uVar37;
      local_118 = uVar24;
    }
  }
LAB_0010c2a5:
  if (uVar38 < uVar24) goto LAB_0010c30f;
  goto LAB_0010c18e;
LAB_0010c30f:
  uVar26 = hasher->free_slot_idx[uVar21];
  hasher->free_slot_idx[uVar21] = uVar26 + 1;
  uVar7 = uVar26 & 0x1ff;
  hasher->tiny_hash[uVar13 & 0xffff] = (uint8_t)uVar32;
  if (0xfffe < uVar31) {
    uVar31 = 0xffff;
  }
  *(short *)((long)&hasher->banks[0].slots[uVar7].delta + (ulong)(uVar21 << 0xb)) = (short)uVar31;
  *(ushort *)((long)&hasher->banks[0].slots[uVar7].next + (ulong)(uVar21 << 0xb)) = uVar3;
  hasher->addr[uVar32] = (uint32_t)uVar13;
  hasher->head[uVar32] = (uint16_t)uVar7;
  if (bVar42) {
    bVar42 = false;
  }
  else {
    if ((hasher->dict_search_stats_).num_lookups >> 7 <= (hasher->dict_search_stats_).num_matches) {
      uVar9 = (ulong)((uint)(*piVar10 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      sVar18 = (hasher->dict_search_stats_).num_lookups;
      bVar42 = false;
      local_e0 = 0;
      lVar29 = 0;
LAB_0010c487:
      uVar3 = kStaticDictionaryHash[uVar9];
      sVar18 = sVar18 + 1;
      (hasher->dict_search_stats_).num_lookups = sVar18;
      if ((ulong)uVar3 != 0) {
        uVar20 = (ulong)(uVar3 & 0x1f);
        bVar6 = true;
        bVar41 = true;
        if (uVar20 <= local_128) {
          pcVar36 = &kBrotliDictionary +
                    uVar20 * (uVar3 >> 5) +
                    (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar20 * 4);
          if (7 < uVar20) {
            uVar34 = (ulong)(uVar3 & 0x18);
            lVar22 = 0;
            uVar12 = 0;
LAB_0010c526:
            if (*(ulong *)(pcVar36 + uVar12 * 8) == *(ulong *)(piVar10 + uVar12 * 2))
            goto code_r0x0010c538;
            uVar34 = *(ulong *)(piVar10 + uVar12 * 2) ^ *(ulong *)(pcVar36 + uVar12 * 8);
            uVar12 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar12 = (uVar12 >> 3 & 0x1fffffff) - lVar22;
            goto LAB_0010c586;
          }
          uVar34 = 0;
          goto LAB_0010c60a;
        }
        goto LAB_0010c4b1;
      }
      goto LAB_0010c4ce;
    }
    bVar42 = true;
  }
  local_e0 = 0;
LAB_0010c3c7:
  bVar41 = false;
  if ((!bVar42) && (local_100 + 700 <= uVar11)) {
    local_c8 = local_c8 + 1;
    bVar41 = iVar19 < 3 && uVar33 + 5 < uVar27;
    local_120 = local_118;
    uVar33 = uVar13;
    local_100 = uVar11;
    local_140 = local_e0;
    local_f0 = uVar39;
    iVar19 = iVar19 + 1;
  }
  uVar14 = uVar14 - 1;
  if (!bVar41) goto LAB_0010c659;
  goto LAB_0010bf51;
code_r0x0010c538:
  uVar12 = uVar12 + 1;
  lVar22 = lVar22 + -8;
  if ((uVar3 & 0x1f) >> 3 == uVar12) goto code_r0x0010c544;
  goto LAB_0010c526;
code_r0x0010c544:
  pcVar36 = pcVar36 + -lVar22;
LAB_0010c60a:
  uVar30 = (ulong)uVar3 & 7;
  uVar12 = uVar34;
  if ((uVar3 & 7) != 0) {
    uVar31 = uVar34 | uVar30;
    do {
      uVar12 = uVar34;
      if (*(char *)((long)piVar10 + uVar34) != *pcVar36) break;
      pcVar36 = pcVar36 + 1;
      uVar34 = uVar34 + 1;
      uVar30 = uVar30 - 1;
      uVar12 = uVar31;
    } while (uVar30 != 0);
  }
LAB_0010c586:
  bVar41 = bVar6;
  if ((uVar12 != 0) && (uVar20 < uVar12 + 10)) {
    uVar34 = (ulong)(uVar3 >> 5) + uVar38 + 1 +
             ((ulong)""[uVar20 - uVar12] << ((&kBrotliDictionarySizeBitsByLength)[uVar20] & 0x3f));
    iVar5 = 0x1f;
    uVar32 = (uint)uVar34;
    if (uVar32 != 0) {
      for (; uVar32 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    uVar30 = (uVar12 * 0x21c - (ulong)(uint)(iVar5 * 0x78)) + 0x1e00;
    if (uVar11 <= uVar30) {
      local_e0 = uVar20 ^ uVar12;
      bVar41 = false;
      uVar39 = uVar12;
      uVar11 = uVar30;
      local_118 = uVar34;
    }
  }
LAB_0010c4b1:
  if (!bVar41) {
    psVar1 = &(hasher->dict_search_stats_).num_matches;
    *psVar1 = *psVar1 + 1;
    bVar42 = true;
  }
LAB_0010c4ce:
  uVar9 = uVar9 + 1;
  bVar41 = lVar29 != 0;
  lVar29 = lVar29 + 1;
  if (bVar41) goto LAB_0010c643;
  goto LAB_0010c487;
LAB_0010c643:
  bVar42 = !bVar42;
  goto LAB_0010c3c7;
LAB_0010c659:
  uVar14 = uVar35;
  if (uVar33 < uVar35) {
    uVar14 = uVar33;
  }
  if (uVar14 < local_120) {
LAB_0010c7c0:
    uVar9 = local_120 + 0xf;
  }
  else {
    uVar32 = 0;
    bVar42 = false;
    if (local_120 != (long)*dist_cache) {
      if (local_120 == (long)dist_cache[1]) {
        uVar32 = 1;
      }
      else {
        uVar9 = (local_120 + 3) - (long)*dist_cache;
        if (uVar9 < 7) {
          bVar28 = (byte)((int)uVar9 << 2);
          uVar32 = 0x9750468;
        }
        else {
          uVar9 = (local_120 + 3) - (long)dist_cache[1];
          if (6 < uVar9) {
            if (local_120 != (long)dist_cache[2]) {
              bVar42 = local_120 != (long)dist_cache[3];
              uVar32 = 3;
              goto LAB_0010c7b7;
            }
            uVar32 = 2;
            goto LAB_0010c7b5;
          }
          bVar28 = (byte)((int)uVar9 << 2);
          uVar32 = 0xfdb1ace;
        }
        uVar32 = uVar32 >> (bVar28 & 0x1f) & 0xf;
      }
LAB_0010c7b5:
      bVar42 = false;
    }
LAB_0010c7b7:
    if (bVar42) goto LAB_0010c7c0;
    uVar9 = (ulong)uVar32;
  }
  if ((local_120 <= uVar14) && (uVar9 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_120;
  }
  uVar32 = (uint)local_c8;
  pCVar40->insert_len_ = uVar32;
  pCVar40->copy_len_ = (uint)local_f0 | (int)local_140 << 0x18;
  if (uVar9 < 0x10) {
    pCVar40->dist_prefix_ = (uint16_t)uVar9;
    uVar21 = 0;
  }
  else {
    uVar21 = 0x1f;
    uVar7 = (uint)(uVar9 - 0xc);
    if (uVar7 != 0) {
      for (; uVar7 >> uVar21 == 0; uVar21 = uVar21 - 1) {
      }
    }
    uVar16 = (uVar21 ^ 0xffffffe0) + 0x1f;
    bVar42 = (uVar9 - 0xc >> ((ulong)uVar16 & 0x3f) & 1) != 0;
    pCVar40->dist_prefix_ = (ushort)bVar42 + (short)(uVar21 ^ 0xffffffe0) * 2 + 0x4c;
    uVar21 = uVar7 - (bVar42 + 2 << ((byte)uVar16 & 0x3f)) | uVar16 * 0x1000000;
  }
  pCVar40->dist_extra_ = uVar21;
  if (5 < local_c8) {
    if (local_c8 < 0x82) {
      uVar32 = 0x1f;
      uVar21 = (uint)(local_c8 - 2);
      if (uVar21 != 0) {
        for (; uVar21 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar32 = (int)(local_c8 - 2 >> ((char)(uVar32 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar32 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_c8 < 0x842) {
      uVar21 = 0x1f;
      if (uVar32 - 0x42 != 0) {
        for (; uVar32 - 0x42 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      uVar32 = (uVar21 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar32 = 0x15;
      if (0x1841 < local_c8) {
        uVar32 = (uint)(ushort)(0x17 - (local_c8 < 0x5842));
      }
    }
  }
  local_140 = local_140 ^ local_f0;
  if (local_140 < 10) {
    uVar21 = (int)local_140 - 2;
  }
  else if (local_140 < 0x86) {
    uVar21 = 0x1f;
    uVar7 = (uint)(local_140 - 6);
    if (uVar7 != 0) {
      for (; uVar7 >> uVar21 == 0; uVar21 = uVar21 - 1) {
      }
    }
    uVar21 = (int)(local_140 - 6 >> ((char)(uVar21 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar21 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar21 = 0x17;
    if (local_140 < 0x846) {
      uVar7 = (int)local_140 - 0x46;
      uVar21 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      uVar21 = (uVar21 ^ 0xffe0) + 0x2c;
    }
  }
  uVar3 = (ushort)uVar21;
  uVar26 = (uVar3 & 7) + ((ushort)uVar32 & 7) * 8;
  if (((pCVar40->dist_prefix_ == 0) && ((ushort)uVar32 < 8)) && (uVar3 < 0x10)) {
    if (7 < uVar3) {
      uVar26 = uVar26 | 0x40;
    }
  }
  else {
    uVar26 = uVar26 | *(ushort *)
                       (CombineLengthCodes_cells +
                       (ulong)(((uVar32 & 0xffff) >> 3) * 3 + ((uVar21 & 0xffff) >> 3)) * 2);
  }
  local_e0 = lVar17 + local_f0 * 2 + uVar33;
  pCVar40->cmd_prefix_ = uVar26;
  *num_literals = *num_literals + local_c8;
  pCVar40 = pCVar40 + 1;
  uVar14 = uVar33 + 2;
  position = uVar33 + local_f0;
  uVar33 = uVar8;
  if (position < uVar8) {
    uVar33 = position;
  }
  if (uVar14 < uVar33) {
    do {
      uVar32 = (uint)(*(int *)(ringbuffer + (uVar14 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar7 = uVar32 & 0x1ff;
      uVar3 = hasher->free_slot_idx[uVar7];
      hasher->free_slot_idx[uVar7] = uVar3 + 1;
      uVar21 = uVar3 & 0x1ff;
      uVar9 = uVar14 - hasher->addr[uVar32];
      hasher->tiny_hash[uVar14 & 0xffff] = (uint8_t)uVar32;
      if (0xfffe < uVar9) {
        uVar9 = 0xffff;
      }
      *(short *)((long)&hasher->banks[0].slots[uVar21].delta + (ulong)(uVar7 << 0xb)) = (short)uVar9
      ;
      *(uint16_t *)((long)&hasher->banks[0].slots[uVar21].next + (ulong)(uVar7 << 0xb)) =
           hasher->head[uVar32];
      hasher->addr[uVar32] = (uint32_t)uVar14;
      hasher->head[uVar32] = (uint16_t)uVar21;
      uVar14 = uVar14 + 1;
    } while (uVar33 != uVar14);
    local_c8 = 0;
  }
  else {
    local_c8 = 0;
  }
LAB_0010ca55:
  uVar33 = position;
  if (uVar27 <= position + 4) goto LAB_0010cac1;
  goto LAB_0010b7db;
}

Assistant:

static BROTLI_NOINLINE void FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, Hasher* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 400;

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_x_code = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    if (FN(FindLongestMatch)(hasher, ringbuffer, ringbuffer_mask, dist_cache,
                             position, max_length, max_distance, &sr)) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 700;
        BROTLI_BOOL is_match_found;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_x_code = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        is_match_found = FN(FindLongestMatch)(hasher, ringbuffer,
            ringbuffer_mask, dist_cache, position + 1, max_length, max_distance,
            &sr2);
        if (is_match_found && sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance, dist_cache);
        if (sr.distance <= max_distance && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
        }
        InitCommand(commands++, insert_length, sr.len, sr.len ^ sr.len_x_code,
            distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them. */
      FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, position + 2,
                     BROTLI_MIN(size_t, position + sr.len, store_end));
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}